

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommDummy.cpp
# Opt level: O2

void __thiscall
adios2::helper::CommImplDummy::Allgatherv
          (CommImplDummy *this,void *sendbuf,size_t sendcount,Datatype sendtype,void *recvbuf,
          size_t *recvcounts,size_t *displs,Datatype recvtype,string *hint)

{
  undefined8 extraout_RAX;
  string *in_stack_ffffffffffffffb8;
  allocator local_29;
  string local_28;
  
  if (*recvcounts == sendcount) {
    Gather(this,sendbuf,sendcount,sendtype,recvbuf,sendcount,recvtype,0,in_stack_ffffffffffffffb8);
    return;
  }
  std::__cxx11::string::string((string *)&local_28,"send and recv counts differ",&local_29);
  anon_unknown_8::CommDummyError(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void CommImplDummy::Allgatherv(const void *sendbuf, size_t sendcount, Datatype sendtype,
                               void *recvbuf, const size_t *recvcounts, const size_t *displs,
                               Datatype recvtype, const std::string &hint) const
{
    const size_t recvcount = recvcounts[0];
    if (recvcount != sendcount)
    {
        return CommDummyError("send and recv counts differ");
    }
    CommImplDummy::Gather(sendbuf, sendcount, sendtype, recvbuf, recvcount, recvtype, 0, hint);
}